

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
agge::tests::LineTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"16",&local_89);
  std::operator+(local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"LineTests",&local_b1);
  std::operator+(in_RDI,local_30);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

test( LineProducesIterator )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				line l(1.0f, 13.0f, 20.0f, 17.0f);

				// ACT / ASSERT
				assert_equal(path_command_move_to, l.vertex(&x, &y));
				assert_equal(path_command_line_to, l.vertex(&x, &y));
				assert_equal(path_command_end_poly, l.vertex(&x, &y));
				assert_equal(path_command_stop, l.vertex(&x, &y));
				assert_equal(path_command_stop, l.vertex(&x, &y));
			}